

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
duckdb_fmt::v6::internal::
specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
::on_dynamic_precision<duckdb_fmt::v6::internal::auto_id>
          (specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
           *this,undefined8 param_2,undefined8 param_3,int param_4)

{
  uint uVar1;
  basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler> *this_00;
  basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>
  *this_01;
  unsigned_long_long uVar2;
  error_handler local_89;
  undefined1 local_88 [32];
  anon_union_16_15_055d57a1_for_value<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_1
  local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  anon_union_16_15_055d57a1_for_value<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_1
  local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  
  this_00 = this->parse_context_;
  uVar1 = this_00->next_arg_id_;
  if ((int)uVar1 < 0) {
    local_68.pointer = &local_58;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"cannot switch from manual to automatic argument indexing","");
    local_88._0_8_ = local_88 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_88,local_68.long_long_value,
               local_68.custom.format + (long)local_68.pointer);
    error_handler::on_error((error_handler *)this_00,(string *)local_88);
  }
  this_01 = this->context_;
  this_00->next_arg_id_ = uVar1 + 1;
  get_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>
            ((format_arg *)&local_48.string,(internal *)this_01,
             (basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>
              *)(ulong)uVar1,param_4);
  local_68.long_long_value = local_48.long_long_value;
  local_68.string.size = local_48.string.size;
  local_58 = local_38;
  uStack_50 = uStack_30;
  local_88._0_8_ = &local_89;
  uVar2 = visit_format_arg<duckdb_fmt::v6::internal::precision_checker<duckdb_fmt::v6::internal::error_handler>,duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>
                    ((precision_checker<duckdb_fmt::v6::internal::error_handler> *)local_88,
                     (basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
                      *)&local_68.string);
  if ((uVar2 & 0xffffffff80000000) == 0) {
    ((this->super_specs_setter<char>).specs_)->precision = (int)uVar2;
    return;
  }
  local_88._0_8_ = local_88 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"number is too big","");
  error_handler::on_error(&local_89,(string *)local_88);
}

Assistant:

FMT_CONSTEXPR format_arg get_arg(auto_id) {
    return internal::get_arg(context_, parse_context_.next_arg_id());
  }